

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>::Delete
          (FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           *this,Index index)

{
  pointer puVar1;
  tuple<wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_> tVar2;
  reference rVar3;
  Index local_18;
  
  puVar1 = (this->list_).
           super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tVar2.super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
  super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_> *)
        &puVar1[index]._M_t.
         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>;
  puVar1[index]._M_t.
  super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> =
       (__uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>)0x0;
  local_18 = index;
  if (tVar2.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::interp::Object_*,_false>)0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                          .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl + 8))()
    ;
  }
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_free_,index);
  *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->free_,&local_18);
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}